

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

void __thiscall
ON_DimStyle::SetDimScale
          (ON_DimStyle *this,double left_val,LengthUnitSystem left_us,double right_val,
          LengthUnitSystem right_us)

{
  bool bVar1;
  ON_ScaleValue local_1b0;
  undefined1 local_130 [8];
  ON_ScaleValue sv;
  ScaleStringFormat fmt;
  undefined1 local_a0 [8];
  ON_LengthValue lvr;
  undefined1 local_68 [7];
  StringFormat right_string_format;
  ON_LengthValue lvl;
  StringFormat left_string_format;
  uint locale_id;
  LengthUnitSystem right_us_local;
  double right_val_local;
  LengthUnitSystem left_us_local;
  double left_val_local;
  ON_DimStyle *this_local;
  
  lvl.m_length_as_string.m_s._7_1_ = (left_us == Inches) + CleanDecimal;
  ON_LengthValue::Create
            ((ON_LengthValue *)local_68,left_val,left_us,0,lvl.m_length_as_string.m_s._7_1_);
  lvr.m_length_as_string.m_s._7_1_ = (right_us == Inches) + CleanDecimal;
  ON_LengthValue::Create
            ((ON_LengthValue *)local_a0,right_val,right_us,0,lvr.m_length_as_string.m_s._7_1_);
  sv.m_right_length.m_length_as_string.m_s._3_1_ = 0;
  ON_ScaleValue::Create
            ((ON_ScaleValue *)local_130,(ON_LengthValue *)local_68,(ON_LengthValue *)local_a0,None);
  bVar1 = ON_ScaleValue::IsSet((ON_ScaleValue *)local_130);
  if (bVar1) {
    ON_ScaleValue::ON_ScaleValue(&local_1b0,(ON_ScaleValue *)local_130);
    SetDimScale(this,&local_1b0);
    ON_ScaleValue::~ON_ScaleValue(&local_1b0);
  }
  ON_ScaleValue::~ON_ScaleValue((ON_ScaleValue *)local_130);
  ON_LengthValue::~ON_LengthValue((ON_LengthValue *)local_a0);
  ON_LengthValue::~ON_LengthValue((ON_LengthValue *)local_68);
  return;
}

Assistant:

void ON_DimStyle::SetDimScale(
  double left_val,
  ON::LengthUnitSystem left_us,
  double right_val,
  ON::LengthUnitSystem right_us)
{
  const unsigned int locale_id = 0; // Will result in current locale id being used
  //const double clean_format_tol = 0.0;


  const ON_LengthValue::StringFormat left_string_format
    = (left_us == ON::LengthUnitSystem::Inches)
    ? ON_LengthValue::StringFormat::CleanProperFraction
    : ON_LengthValue::StringFormat::CleanDecimal;
  ON_LengthValue lvl = ON_LengthValue::Create(left_val, left_us, locale_id, left_string_format);

  const ON_LengthValue::StringFormat right_string_format
    = (right_us == ON::LengthUnitSystem::Inches)
    ? ON_LengthValue::StringFormat::CleanProperFraction
    : ON_LengthValue::StringFormat::CleanDecimal;
  ON_LengthValue lvr = ON_LengthValue::Create(right_val, right_us, locale_id, right_string_format);

  const ON_ScaleValue::ScaleStringFormat fmt = ON_ScaleValue::ScaleStringFormat::None;
  ON_ScaleValue sv = ON_ScaleValue::Create(lvl, lvr, fmt);
  if (sv.IsSet())
  {
    ON_DimStyle::SetDimScale(sv);
  }
}